

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

MapIterator * __thiscall
google::protobuf::Reflection::MapEnd
          (MapIterator *__return_storage_ptr__,Reflection *this,Message *message,
          FieldDescriptor *field)

{
  bool bVar1;
  MapFieldBase *this_00;
  
  if (field->type_ == '\v') {
    bVar1 = FieldDescriptor::is_map_message_type(field);
    if (bVar1) {
      MapIterator::MapIterator(__return_storage_ptr__,message,field);
      this_00 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      protobuf::internal::MapFieldBase::MapEnd(this_00,__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  anon_unknown_6::ReportReflectionUsageError
            (this->descriptor_,field,"MapEnd","Field is not a map field.");
}

Assistant:

MapIterator Reflection::MapEnd(Message* message,
                               const FieldDescriptor* field) const {
  USAGE_CHECK(IsMapFieldInApi(field), MapEnd, "Field is not a map field.");
  MapIterator iter(message, field);
  GetRaw<MapFieldBase>(*message, field).MapEnd(&iter);
  return iter;
}